

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O1

EbmlElement * __thiscall
libebml::EbmlMaster::FindNextElt(EbmlMaster *this,EbmlElement *PastElt,bool bCreateIfNull)

{
  pointer ppEVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  EbmlElement *local_38;
  EbmlElement *pEVar6;
  
  ppEVar1 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1;
  if (lVar4 == 0) {
    uVar8 = 0;
  }
  else {
    lVar4 = lVar4 >> 3;
    uVar5 = lVar4 + (ulong)(lVar4 == 0);
    uVar7 = 1;
    do {
      uVar8 = uVar7;
      if (ppEVar1[uVar7 - 1] == PastElt) break;
      bVar9 = uVar7 != uVar5;
      uVar8 = uVar5;
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  for (; uVar8 < (ulong)((long)(this->ElementList).
                               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->ElementList).
                               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
    iVar2 = (*PastElt->_vptr_EbmlElement[3])(PastElt);
    iVar3 = *(int *)CONCAT44(extraout_var,iVar2);
    lVar4 = *(long *)((int *)CONCAT44(extraout_var,iVar2) + 2);
    iVar2 = (*(this->ElementList).
              super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar8]->_vptr_EbmlElement[3])();
    if ((*(long *)((int *)CONCAT44(extraout_var_00,iVar2) + 2) == lVar4) &&
       (*(int *)CONCAT44(extraout_var_00,iVar2) == iVar3)) break;
  }
  ppEVar1 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (uVar8 == (long)(this->ElementList).
                     super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) {
    if (bCreateIfNull) {
      iVar3 = (*PastElt->_vptr_EbmlElement[5])(PastElt);
      pEVar6 = (EbmlElement *)CONCAT44(extraout_var_01,iVar3);
      local_38 = pEVar6;
      std::vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>>::
      emplace_back<libebml::EbmlElement*>
                ((vector<libebml::EbmlElement*,std::allocator<libebml::EbmlElement*>> *)
                 &this->ElementList,&local_38);
    }
    else {
      pEVar6 = (EbmlElement *)0x0;
    }
  }
  else {
    pEVar6 = ppEVar1[uVar8];
  }
  return pEVar6;
}

Assistant:

EbmlElement *EbmlMaster::FindNextElt(const EbmlElement & PastElt, bool bCreateIfNull)
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if ((ElementList[Index]) == &PastElt) {
      // found past element, new one is :
      Index++;
      break;
    }
  }

  while (Index < ElementList.size()) {
    if ((EbmlId)PastElt == (EbmlId)(*ElementList[Index]))
      break;
    Index++;
  }

  if (Index != ElementList.size())
    return ElementList[Index];

  if (bCreateIfNull) {
    // add the element
    EbmlElement *NewElt = &(PastElt.CreateElement());
    if (NewElt == NULL)
      return NULL;

    if (!PushElement(*NewElt)) {
      delete NewElt;
      NewElt = NULL;
    }
    return NewElt;
  }

  return NULL;
}